

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O0

_Bool beenChecked(int *prevChecked,int position)

{
  int local_24;
  int i;
  int arrayLength;
  int position_local;
  int *prevChecked_local;
  
  local_24 = 0;
  while( true ) {
    if (0x47f < local_24) {
      return false;
    }
    if (prevChecked[local_24] == position) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool beenChecked(int prevChecked[], int position) {
    int arrayLength;

    arrayLength = MAP_COLS * MAP_ROWS;
    for (int i = 0; i < arrayLength; i++) {
        if (prevChecked[i] == position)
            return true;
    }
    return false;
}